

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void cmLocalUnixMakefileGenerator3::WriteCMakeArgument(ostream *os,string *s)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  long lVar4;
  char *pcVar5;
  size_type sVar6;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
  sVar2 = s->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (s->_M_dataplus)._M_p;
    sVar6 = 0;
    do {
      cVar1 = pcVar3[sVar6];
      if (cVar1 == '\"') {
        lVar4 = 2;
        pcVar5 = "\\\"";
      }
      else if (cVar1 == '\\') {
        lVar4 = 2;
        pcVar5 = "\\\\";
      }
      else {
        lVar4 = 1;
        pcVar5 = &local_33;
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,lVar4);
      sVar6 = sVar6 + 1;
    } while (sVar2 != sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteCMakeArgument(std::ostream& os,
                                                       const std::string& s)
{
  // Write the given string to the stream with escaping to get it back
  // into CMake through the lexical scanner.
  os << '"';
  for (char c : s) {
    if (c == '\\') {
      os << "\\\\";
    } else if (c == '"') {
      os << "\\\"";
    } else {
      os << c;
    }
  }
  os << '"';
}